

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_step(lua_State *L)

{
  global_State *g_00;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gcstp == '\0') {
    if ((g_00->gckind == '\x01') || (g_00->lastatomic != 0)) {
      genstep(L,g_00);
    }
    else {
      incstep(L,g_00);
    }
  }
  else {
    luaE_setdebt(g_00,-2000);
  }
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  if (!gcrunning(g))  /* not running? */
    luaE_setdebt(g, -2000);
  else {
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}